

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::parseLine
          (MultipoleAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  string *psVar6;
  double *pdVar7;
  long lVar8;
  char *__format;
  string *psVar9;
  MultipoleAtomTypesSectionParser *pMVar10;
  long lVar11;
  uint j_3;
  double *pdVar12;
  uint k;
  long lVar13;
  bool isDipole;
  RealType RVar14;
  double dVar15;
  RealType dipoleMoment;
  string multipoleType;
  string atomTypeName;
  StringTokenizer tokenizer;
  Mat3x3d quadrupole;
  RectMatrix<double,_3U,_3U> result_1;
  SquareMatrix3<double> result;
  Vector<double,_3U> result_2;
  RealType local_340;
  RealType local_338;
  RealType local_328;
  undefined1 local_318 [32];
  Vector3d local_2f8;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  MultipoleAdapter local_2c0;
  string local_2b8;
  string local_298;
  double dStack_278;
  double local_270;
  double dStack_268;
  double local_260;
  double local_258;
  StringTokenizer local_250;
  double local_1f8 [10];
  double local_1a8 [10];
  double local_158;
  double local_148;
  double local_138;
  Vector3d local_128;
  double local_108 [10];
  double local_b8 [9];
  Mat3x3d local_70;
  
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298," ;\t\n\r","");
  psVar9 = &local_298;
  StringTokenizer::StringTokenizer(&local_250,line,psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  iVar3 = StringTokenizer::countTokens(&local_250);
  if (iVar3 < 5) {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
    goto LAB_001a44ab;
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_2b8,&local_250);
  StringTokenizer::nextToken_abi_cxx11_((string *)local_318,&local_250);
  local_328 = StringTokenizer::nextTokenAsDouble(&local_250);
  local_338 = StringTokenizer::nextTokenAsDouble(&local_250);
  RVar14 = StringTokenizer::nextTokenAsDouble(&local_250);
  local_2c0.at_ = ForceField::getAtomType(ff,&local_2b8);
  if (local_2c0.at_ == (AtomType *)0x0) {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Can not find matched AtomType[%s] at line %d\n"
             ,local_2b8._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  local_328 = (local_328 * 3.141592653589793) / 180.0;
  local_338 = (local_338 * 3.141592653589793) / 180.0;
  dVar15 = (RVar14 * 3.141592653589793) / 180.0;
  local_148 = sin(local_328);
  local_138 = sin(local_338);
  local_158 = sin(dVar15);
  local_328 = cos(local_328);
  local_338 = cos(local_338);
  local_270 = cos(dVar15);
  local_298.field_2._M_allocated_capacity = (size_type)(local_138 * local_158);
  local_298._M_dataplus._M_p = (pointer)(local_270 * local_328 + local_158 * -local_338 * local_148)
  ;
  local_298._M_string_length =
       (size_type)(local_270 * local_148 + local_158 * local_338 * local_328);
  local_298.field_2._8_8_ = local_270 * -local_338 * local_148 - local_328 * local_158;
  dStack_278 = local_270 * local_338 * local_328 - local_148 * local_158;
  local_270 = local_138 * local_270;
  dStack_268 = local_138 * local_148;
  local_260 = -local_138 * local_328;
  local_258 = local_338;
  local_340 = 0.0;
  local_2c8 = (double)OpenMD::V3Zero._16_8_;
  local_2d8 = (double)OpenMD::V3Zero._0_8_;
  dStack_2d0 = (double)OpenMD::V3Zero._8_8_;
  local_2f8.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  local_2f8.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_2f8.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  local_1f8[8] = 0.0;
  local_1f8[6] = 0.0;
  local_1f8[7] = 0.0;
  local_1f8[4] = 0.0;
  local_1f8[5] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[3] = 0.0;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  pMVar10 = (MultipoleAtomTypesSectionParser *)local_318;
  iVar3 = std::__cxx11::string::compare((char *)pMVar10);
  if (iVar3 == 0) {
    parseDipole(pMVar10,&local_250,&local_340,lineNo);
LAB_001a4063:
    pdVar5 = local_108;
    local_108[6] = 0.0;
    local_108[7] = 0.0;
    local_108[4] = 0.0;
    local_108[5] = 0.0;
    local_108[2] = 0.0;
    local_108[3] = 0.0;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    local_108[8] = 0.0;
    psVar6 = &local_298;
    lVar8 = 0;
    do {
      lVar11 = 0;
      pdVar7 = pdVar5;
      do {
        *pdVar7 = (double)(&psVar6->_M_dataplus)[lVar11]._M_p;
        lVar11 = lVar11 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar11 != 3);
      lVar8 = lVar8 + 1;
      pdVar5 = pdVar5 + 1;
      psVar6 = (string *)((psVar6->field_2)._M_local_buf + 8);
    } while (lVar8 != 3);
    pdVar5 = local_1a8;
    local_1a8[6] = 0.0;
    local_1a8[7] = 0.0;
    local_1a8[4] = 0.0;
    local_1a8[5] = 0.0;
    local_1a8[2] = 0.0;
    local_1a8[3] = 0.0;
    local_1a8[0] = 0.0;
    local_1a8[1] = 0.0;
    local_1a8[8] = 0.0;
    pdVar7 = local_108;
    lVar8 = 0;
    do {
      lVar11 = 0;
      do {
        pdVar5[lVar11] = pdVar7[lVar11] * local_340;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar8 = lVar8 + 1;
      pdVar5 = pdVar5 + 3;
      pdVar7 = pdVar7 + 3;
    } while (lVar8 != 3);
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[2] = 0.0;
    pdVar5 = local_1a8;
    lVar8 = 0;
    do {
      dVar15 = local_b8[lVar8];
      lVar11 = 0;
      do {
        dVar15 = dVar15 + *(double *)((long)pdVar5 + lVar11) *
                          *(double *)((long)&OpenMD::V3Z + lVar11);
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x18);
      local_b8[lVar8] = dVar15;
      lVar8 = lVar8 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar8 != 3);
    local_2c8 = local_b8[2];
    local_2d8 = local_b8[0];
    dStack_2d0 = local_b8[1];
    isDipole = true;
    bVar2 = true;
    if (iVar3 == 0) {
      bVar2 = false;
    }
    else {
LAB_001a4201:
      isDipole = bVar2;
      local_1f8[0] = local_2f8.super_Vector<double,_3U>.data_[0];
      local_1f8[4] = local_2f8.super_Vector<double,_3U>.data_[1];
      local_1f8[8] = local_2f8.super_Vector<double,_3U>.data_[2];
      pdVar5 = local_b8;
      local_b8[6] = 0.0;
      local_b8[7] = 0.0;
      local_b8[4] = 0.0;
      local_b8[5] = 0.0;
      local_b8[2] = 0.0;
      local_b8[3] = 0.0;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[8] = 0.0;
      lVar8 = 0;
      do {
        lVar11 = 0;
        pdVar7 = pdVar5;
        do {
          *pdVar7 = (double)(&psVar9->_M_dataplus)[lVar11]._M_p;
          lVar11 = lVar11 + 1;
          pdVar7 = pdVar7 + 3;
        } while (lVar11 != 3);
        lVar8 = lVar8 + 1;
        pdVar5 = pdVar5 + 1;
        psVar9 = (string *)((psVar9->field_2)._M_local_buf + 8);
      } while (lVar8 != 3);
      local_108[6] = 0.0;
      local_108[7] = 0.0;
      local_108[4] = 0.0;
      local_108[5] = 0.0;
      local_108[2] = 0.0;
      local_108[3] = 0.0;
      local_108[0] = 0.0;
      local_108[1] = 0.0;
      local_108[8] = 0.0;
      pdVar5 = local_b8;
      lVar8 = 0;
      do {
        lVar11 = 0;
        pdVar7 = local_1f8;
        do {
          dVar15 = local_108[lVar8 * 3 + lVar11];
          lVar13 = 0;
          pdVar12 = pdVar7;
          do {
            dVar15 = dVar15 + pdVar5[lVar13] * *pdVar12;
            lVar13 = lVar13 + 1;
            pdVar12 = pdVar12 + 3;
          } while (lVar13 != 3);
          local_108[lVar8 * 3 + lVar11] = dVar15;
          lVar11 = lVar11 + 1;
          pdVar7 = pdVar7 + 1;
        } while (lVar11 != 3);
        lVar8 = lVar8 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar8 != 3);
      local_1a8[6] = 0.0;
      local_1a8[7] = 0.0;
      local_1a8[4] = 0.0;
      local_1a8[5] = 0.0;
      local_1a8[2] = 0.0;
      local_1a8[3] = 0.0;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[8] = 0.0;
      pdVar5 = local_108;
      lVar8 = 0;
      do {
        lVar11 = 0;
        psVar9 = &local_298;
        do {
          dVar15 = local_1a8[lVar8 * 3 + lVar11];
          lVar13 = 0;
          psVar6 = psVar9;
          do {
            dVar15 = dVar15 + pdVar5[lVar13] * (double)(psVar6->_M_dataplus)._M_p;
            lVar13 = lVar13 + 1;
            psVar6 = (string *)((psVar6->field_2)._M_local_buf + 8);
          } while (lVar13 != 3);
          local_1a8[lVar8 * 3 + lVar11] = dVar15;
          lVar11 = lVar11 + 1;
          psVar9 = (string *)&psVar9->_M_string_length;
        } while (lVar11 != 3);
        lVar8 = lVar8 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        *(undefined8 *)((long)local_1f8 + lVar8 + 0x10) =
             *(undefined8 *)((long)local_1a8 + lVar8 + 0x10);
        uVar1 = *(undefined8 *)((long)local_1a8 + lVar8 + 8);
        *(undefined8 *)((long)local_1f8 + lVar8) = *(undefined8 *)((long)local_1a8 + lVar8);
        *(undefined8 *)((long)local_1f8 + lVar8 + 8) = uVar1;
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x48);
      bVar2 = true;
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare(local_318);
    if (iVar4 == 0) {
      __format = 
      "MultipoleAtomTypesSectionParser Error: \n\tsplit dipoles (type s) have been deprecated (line: %d)\n"
      ;
    }
    else {
      pMVar10 = (MultipoleAtomTypesSectionParser *)local_318;
      iVar4 = std::__cxx11::string::compare((char *)pMVar10);
      if (iVar4 == 0) {
        parseQuadrupole(pMVar10,&local_250,&local_2f8,lineNo);
        bVar2 = false;
        goto LAB_001a4201;
      }
      pMVar10 = (MultipoleAtomTypesSectionParser *)local_318;
      iVar4 = std::__cxx11::string::compare((char *)pMVar10);
      if (iVar4 == 0) {
        parseDipole(pMVar10,&local_250,&local_340,lineNo);
        parseQuadrupole(pMVar10,&local_250,&local_2f8,lineNo);
        goto LAB_001a4063;
      }
      iVar3 = std::__cxx11::string::compare(local_318);
      __format = "MultipoleAtomTypesSectionParser Error: unrecognized multiple type at line %d\n";
      if (iVar3 == 0) {
        __format = 
        "MultipoleAtomTypesSectionParser Error: \n\tsplit dipole quadrupoles (type sq) have been deprecated (line: %d)\n"
        ;
      }
    }
    isDipole = false;
    snprintf(painCave.errMsg,2000,__format,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
    bVar2 = false;
  }
  local_128.super_Vector<double,_3U>.data_[2] = local_2c8;
  local_128.super_Vector<double,_3U>.data_[0] = local_2d8;
  local_128.super_Vector<double,_3U>.data_[1] = dStack_2d0;
  lVar8 = 0;
  do {
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar8 + 0x10) = *(undefined8 *)((long)local_1f8 + lVar8 + 0x10);
    uVar1 = *(undefined8 *)((long)local_1f8 + lVar8 + 8);
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar8
     ) = *(undefined8 *)((long)local_1f8 + lVar8);
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar8 + 8) = uVar1;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  MultipoleAdapter::makeMultipole(&local_2c0,&local_128,&local_70,isDipole,bVar2);
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
LAB_001a44ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.delim_._M_dataplus._M_p != &local_250.delim_.field_2) {
    operator_delete(local_250.delim_._M_dataplus._M_p,
                    local_250.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.tokenString_._M_dataplus._M_p != &local_250.tokenString_.field_2) {
    operator_delete(local_250.tokenString_._M_dataplus._M_p,
                    local_250.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MultipoleAtomTypesSectionParser::parseLine(ForceField& ff,
                                                  const std::string& line,
                                                  int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // name multipole_type theta phi psi
    // "name" must match the name in the AtomTypes section
    //
    // avaliable multipole types are:
    // d  (dipole)
    // q  (quadrupole)
    // dq (dipole plus quadrupole)
    //
    // Directionality for dipoles and quadrupoles is given by three
    // euler angles (phi, theta, psi), because the body-fixed
    // reference frame for directional atoms is determined by the
    // *mass* distribution and not by the charge distribution.
    //
    // Dipoles are given in units of Debye
    // Quadrupoles are given in units of esu centibarn
    //
    // Examples:
    //
    // name d phi theta psi dipole_moment
    // name q phi theta psi Qxx Qyy Qzz
    // name dq phi theta psi dipole_moment Qxx Qyy Qzz

    if (nTokens < 5) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName  = tokenizer.nextToken();
      std::string multipoleType = tokenizer.nextToken();
      RealType phi   = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;
      RealType theta = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;
      RealType psi   = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: Can not find matched "
                 "AtomType[%s] "
                 "at line %d\n",
                 atomTypeName.c_str(), lineNo);
        painCave.isFatal = 1;
        simError();
      }

      MultipoleAdapter ma = MultipoleAdapter(atomType);

      RotMat3x3d eFrame(0.0);

      eFrame.setupRotMat(phi, theta, psi);

      RealType dipoleMoment(0);
      Vector3d dipole(V3Zero);
      Vector3d quadrupoleMoments(V3Zero);
      Mat3x3d quadrupole(0.0);

      bool isDipole(false);
      bool isQuadrupole(false);

      if (multipoleType == "d") {
        parseDipole(tokenizer, dipoleMoment, lineNo);
        isDipole = true;
      } else if (multipoleType == "s") {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: \n"
                 "\tsplit dipoles (type s) have been deprecated (line: %d)\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else if (multipoleType == "q") {
        parseQuadrupole(tokenizer, quadrupoleMoments, lineNo);
        isQuadrupole = true;
      } else if (multipoleType == "dq") {
        parseDipole(tokenizer, dipoleMoment, lineNo);
        isDipole = true;
        parseQuadrupole(tokenizer, quadrupoleMoments, lineNo);
        isQuadrupole = true;
      } else if (multipoleType == "sq") {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: \n"
                 "\tsplit dipole quadrupoles (type sq) have been deprecated "
                 "(line: %d)\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: unrecognized multiple "
                 "type at line "
                 "%d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
      if (isDipole) dipole = dipoleMoment * eFrame.transpose() * V3Z;
      if (isQuadrupole) {
        quadrupole(0, 0) = quadrupoleMoments(0);
        quadrupole(1, 1) = quadrupoleMoments(1);
        quadrupole(2, 2) = quadrupoleMoments(2);
        quadrupole       = eFrame.transpose() * quadrupole * eFrame;
      }

      ma.makeMultipole(dipole, quadrupole, isDipole, isQuadrupole);
    }
  }